

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int PutCoeffs(VP8BitWriter *bw,int ctx,VP8Residual *res)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  ProbaArray *paauVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ushort uVar9;
  long lVar10;
  uint uVar11;
  uint8_t (*pauVar12) [11];
  uint uVar13;
  long lVar14;
  uint8_t *puVar15;
  int local_58;
  
  iVar8 = res->first;
  lVar14 = (long)iVar8;
  paauVar4 = res->prob;
  iVar7 = VP8PutBit(bw,(uint)~res->last >> 0x1f,(uint)paauVar4[lVar14][ctx][0]);
  if (iVar7 == 0) {
    local_58 = 0;
  }
  else {
    local_58 = 1;
    if (iVar8 < 0x10) {
      pauVar12 = paauVar4[lVar14] + ctx;
      do {
        lVar1 = lVar14 + 1;
        uVar3 = res->coeffs[lVar14];
        uVar9 = -uVar3;
        if (0 < (short)uVar3) {
          uVar9 = uVar3;
        }
        iVar8 = VP8PutBit(bw,(uint)(uVar3 != 0),(uint)(*pauVar12)[1]);
        if (iVar8 == 0) {
          pauVar12 = (uint8_t (*) [11])
                     ((long)*res->prob + (ulong)""[lVar14 + 1] * 0x20 + (ulong)""[lVar14 + 1]);
        }
        else {
          iVar8 = VP8PutBit(bw,(uint)(1 < uVar9),(uint)(*pauVar12)[2]);
          if (iVar8 == 0) {
            lVar10 = 1;
          }
          else {
            iVar8 = VP8PutBit(bw,(uint)(4 < uVar9),(uint)(*pauVar12)[3]);
            if (iVar8 == 0) {
              iVar8 = VP8PutBit(bw,(uint)(uVar9 != 2),(uint)(*pauVar12)[4]);
              lVar10 = 2;
              if (iVar8 != 0) {
                VP8PutBit(bw,(uint)(uVar9 == 4),(uint)(*pauVar12)[5]);
              }
            }
            else {
              uVar11 = (uint)uVar9;
              iVar8 = VP8PutBit(bw,(uint)(10 < uVar9),(uint)(*pauVar12)[6]);
              if (iVar8 == 0) {
                iVar8 = VP8PutBit(bw,(uint)(6 < uVar9),(uint)(*pauVar12)[7]);
                if (iVar8 == 0) {
                  uVar11 = (uint)(uVar11 == 6);
                  iVar8 = 0x9f;
                }
                else {
                  VP8PutBit(bw,(uint)(8 < uVar9),0xa5);
                  uVar11 = ~uVar11 & 1;
                  iVar8 = 0x91;
                }
                VP8PutBit(bw,uVar11,iVar8);
              }
              else {
                if (uVar9 < 0x13) {
                  VP8PutBit(bw,0,(uint)(*pauVar12)[8]);
                  VP8PutBit(bw,0,(uint)(*pauVar12)[9]);
                  uVar13 = 4;
                  iVar8 = -0xb;
                  puVar15 = VP8Cat3;
                }
                else if (uVar9 < 0x23) {
                  VP8PutBit(bw,0,(uint)(*pauVar12)[8]);
                  VP8PutBit(bw,1,(uint)(*pauVar12)[9]);
                  uVar13 = 8;
                  iVar8 = -0x13;
                  puVar15 = VP8Cat4;
                }
                else {
                  VP8PutBit(bw,1,(uint)(*pauVar12)[8]);
                  if (uVar9 < 0x43) {
                    VP8PutBit(bw,0,(uint)(*pauVar12)[10]);
                    uVar13 = 0x10;
                    iVar8 = -0x23;
                    puVar15 = VP8Cat5;
                  }
                  else {
                    VP8PutBit(bw,1,(uint)(*pauVar12)[10]);
                    uVar13 = 0x400;
                    iVar8 = -0x43;
                    puVar15 = VP8Cat6;
                  }
                }
                do {
                  bVar2 = *puVar15;
                  puVar15 = puVar15 + 1;
                  VP8PutBit(bw,(uint)((uVar13 & iVar8 + uVar11) != 0),(uint)bVar2);
                  bVar5 = 1 < uVar13;
                  uVar13 = uVar13 >> 1;
                } while (bVar5);
              }
              lVar10 = 2;
            }
          }
          paauVar4 = res->prob;
          bVar2 = ""[lVar14 + 1];
          VP8PutBitUniform(bw,(uint)(uVar3 >> 0xf));
          if (lVar1 == 0x10) {
            return 1;
          }
          lVar6 = (ulong)bVar2 * 0x20 + (ulong)bVar2;
          iVar8 = VP8PutBit(bw,(uint)(lVar14 < res->last),
                            (uint)*(byte *)((long)*paauVar4 + lVar10 * 0xb + lVar6));
          if (iVar8 == 0) {
            return 1;
          }
          pauVar12 = (uint8_t (*) [11])((long)*paauVar4 + lVar10 * 0xb + lVar6);
        }
        lVar14 = lVar1;
      } while (lVar1 != 0x10);
      local_58 = 1;
    }
  }
  return local_58;
}

Assistant:

static int PutCoeffs(VP8BitWriter* const bw, int ctx, const VP8Residual* res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const uint8_t* p = res->prob[n][ctx];
  if (!VP8PutBit(bw, res->last >= 0, p[0])) {
    return 0;
  }

  while (n < 16) {
    const int c = res->coeffs[n++];
    const int sign = c < 0;
    int v = sign ? -c : c;
    if (!VP8PutBit(bw, v != 0, p[1])) {
      p = res->prob[VP8EncBands[n]][0];
      continue;
    }
    if (!VP8PutBit(bw, v > 1, p[2])) {
      p = res->prob[VP8EncBands[n]][1];
    } else {
      if (!VP8PutBit(bw, v > 4, p[3])) {
        if (VP8PutBit(bw, v != 2, p[4])) {
          VP8PutBit(bw, v == 4, p[5]);
        }
      } else if (!VP8PutBit(bw, v > 10, p[6])) {
        if (!VP8PutBit(bw, v > 6, p[7])) {
          VP8PutBit(bw, v == 6, 159);
        } else {
          VP8PutBit(bw, v >= 9, 165);
          VP8PutBit(bw, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        if (v < 3 + (8 << 1)) {          // VP8Cat3  (3b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 0, p[9]);
          v -= 3 + (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (v < 3 + (8 << 2)) {   // VP8Cat4  (4b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 1, p[9]);
          v -= 3 + (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (v < 3 + (8 << 3)) {   // VP8Cat5  (5b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 0, p[10]);
          v -= 3 + (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 1, p[10]);
          v -= 3 + (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          VP8PutBit(bw, !!(v & mask), *tab++);
          mask >>= 1;
        }
      }
      p = res->prob[VP8EncBands[n]][2];
    }
    VP8PutBitUniform(bw, sign);
    if (n == 16 || !VP8PutBit(bw, n <= res->last, p[0])) {
      return 1;   // EOB
    }
  }
  return 1;
}